

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit
          (RenameLinkedVar *this,SequentialStmtBlock *stmt)

{
  bool bVar1;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_00;
  reference pEVar2;
  Var *pVVar3;
  Var *v;
  EventControl *e;
  iterator __end2;
  iterator __begin2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *conds;
  SequentialStmtBlock *stmt_local;
  RenameLinkedVar *this_local;
  
  this_00 = SequentialStmtBlock::get_event_controls(stmt);
  __end2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_00);
  e = (EventControl *)
      std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&e);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
             ::operator*(&__end2);
    pVVar3 = match(this,pEVar2->var);
    if (pVVar3 != (Var *)0x0) {
      pEVar2->var = pVVar3;
    }
    __gnu_cxx::
    __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
            auto& conds = stmt->get_event_controls();
            for (auto& e : conds) {
                if (auto* v = match(e.var)) {
                    e.var = v;
                }
            }
        }